

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O2

void __thiscall glslang::TPpContext::push_include(TPpContext *this,IncludeResult *result)

{
  IncludeResult *local_18;
  
  local_18 = result;
  std::__cxx11::string::_M_assign((string *)&this->currentSourceFile);
  std::
  deque<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
  ::push_back(&(this->includeStack).c,&local_18);
  return;
}

Assistant:

void push_include(TShader::Includer::IncludeResult* result)
    {
        currentSourceFile = result->headerName;
        includeStack.push(result);
    }